

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O3

void __thiscall Loop_While_Test::~Loop_While_Test(Loop_While_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Loop, While) {
	MockParser mock(
		"let a = 0\n"
		"while a < 100 {\n"
		"  a += 1\n"
		"}\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_GE_LN, 0, 1); // Condition
	JMP(3); // Jump to after
	INS(BC_ADD_LN, 0, 0, 2); // Body
	LOOP(-3); // Jump to condition

	INS(BC_RET, 0, 0, 0); // After
}